

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageobj.c
# Opt level: O1

TidyMessageImpl *
prvTidytidyMessageCreateWithNode(TidyDocImpl *doc,Node *node,uint code,TidyReportLevel level,...)

{
  char in_AL;
  TidyMessageImpl *pTVar1;
  uint line;
  uint column;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args_copy;
  __va_list_tag local_d8;
  undefined1 local_b8 [32];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  if (node == (Node *)0x0) {
    if (doc->lexer == (Lexer *)0x0) {
      line = 0;
    }
    else {
      line = doc->lexer->lines;
    }
  }
  else {
    line = node->line;
  }
  if (node == (Node *)0x0) {
    if (doc->lexer == (Lexer *)0x0) {
      column = 0;
    }
    else {
      column = doc->lexer->columns;
    }
  }
  else {
    column = node->column;
  }
  local_d8.reg_save_area = local_b8;
  local_d8.overflow_arg_area = &stack0x00000008;
  local_d8.gp_offset = 0x20;
  local_d8.fp_offset = 0x30;
  local_98 = in_R8;
  local_90 = in_R9;
  pTVar1 = tidyMessageCreateInitV(doc,node,code,line,column,level,&local_d8);
  return pTVar1;
}

Assistant:

TidyMessageImpl *TY_(tidyMessageCreateWithNode)( TidyDocImpl *doc,
                                                 Node *node,
                                                 uint code,
                                                 TidyReportLevel level,
                                                 ... )
{
    TidyMessageImpl *result;
    va_list args_copy;
    int line = ( node ? node->line :
                ( doc->lexer ? doc->lexer->lines : 0 ) );
    int col  = ( node ? node->column :
                ( doc->lexer ? doc->lexer->columns : 0 ) );
    
    va_start(args_copy, level);
    result = tidyMessageCreateInitV(doc, node, code, line, col, level, args_copy);
    va_end(args_copy);
    
    return result;
}